

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O0

Result Clasp::ClauseCreator::integrate
                 (Solver *s,SharedLiterals *clause,uint32 modeFlags,ConstraintType t)

{
  undefined1 uVar1;
  bool bVar2;
  Status SVar3;
  uint32 uVar4;
  Literal p;
  SharedContext *this;
  Literal *last;
  ConstraintType in_ECX;
  uint in_EDX;
  SharedLiterals *in_RSI;
  Solver *in_RDI;
  Result RVar5;
  uint32 lbd;
  uint32 impLevel;
  Antecedent ante;
  Status xs;
  uint32 impSize;
  ClauseRep x;
  Literal temp [5];
  Sink shared;
  Result result;
  ConstraintType t_00;
  uint32 in_stack_fffffffffffffe3c;
  ConstraintType in_stack_fffffffffffffe40;
  ConstraintScore in_stack_fffffffffffffe44;
  ClauseRep *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  Solver *in_stack_fffffffffffffe58;
  Solver *in_stack_fffffffffffffe60;
  Antecedent *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 uVar6;
  Solver *pSVar7;
  Literal *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  uint32 uVar8;
  ConstraintInfo *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  Solver *in_stack_fffffffffffffee0;
  Literal *in_stack_fffffffffffffef8;
  DecisionHeuristic *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined2 in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff16;
  byte bVar9;
  Literal *local_a8;
  SharedLiterals *local_a0;
  Antecedent local_80;
  undefined4 local_78;
  Status local_74;
  uint local_70;
  ConstraintInfo local_6c;
  ClauseRep local_68;
  uint32 local_58;
  Literal local_48;
  Literal local_44 [4];
  Literal LStack_34;
  Sink local_30;
  ConstraintType local_28;
  uint local_24;
  SharedLiterals *local_20;
  undefined8 local_18;
  Result local_10;
  
  local_a0 = in_RSI;
  if ((in_EDX & 0x20) != 0) {
    local_a0 = (SharedLiterals *)0x0;
  }
  local_28 = in_ECX;
  local_24 = in_EDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  Detail::Sink::Sink(&local_30,local_a0);
  local_a8 = &local_48;
  do {
    Literal::Literal(local_a8);
    uVar4 = (uint32)((ulong)in_stack_fffffffffffffed0 >> 0x20);
    uVar8 = (uint32)((ulong)in_stack_fffffffffffffec0 >> 0x20);
    local_a8 = local_a8 + 1;
  } while (local_a8 != &LStack_34);
  local_58 = (uint32)lit_false();
  local_48 = (Literal)local_58;
  local_44[0] = (Literal)local_58;
  SharedLiterals::begin(local_20);
  SharedLiterals::size(local_20);
  ConstraintInfo::ConstraintInfo(&local_6c,local_28);
  t_00 = 5;
  local_68 = prepare(in_stack_fffffffffffffee0,
                     (Literal *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),uVar4,
                     in_stack_fffffffffffffec8,uVar8,in_stack_fffffffffffffeb8,
                     (uint32)in_stack_ffffffffffffff00);
  bVar9 = 1;
  if ((local_24 & 2) == 0) {
    in_stack_ffffffffffffff16 =
         Solver::allowImplicit(in_stack_fffffffffffffe60,(ClauseRep *)in_stack_fffffffffffffe58);
    bVar9 = in_stack_ffffffffffffff16 ^ 0xff;
  }
  uVar8 = (uint32)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  local_70 = ((byte)~bVar9 & 1) * 2 + 1;
  SVar3 = status(in_stack_fffffffffffffe58,
                 (ClauseRep *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  local_74 = SVar3;
  uVar1 = ignoreClause(in_stack_fffffffffffffe58,
                       (ClauseRep *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       (Status)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                       (uint32)in_stack_fffffffffffffe48);
  if ((bool)uVar1) {
    Result::Result(&local_10,(ClauseHead *)0x0,local_74);
    goto LAB_0022c128;
  }
  Result::Result(&local_10,(ClauseHead *)0x0,local_74);
  if ((local_24 & 0x200) == 0) {
    in_stack_ffffffffffffff00 = Solver::heuristic((Solver *)0x22bc76);
    pSVar7 = local_18;
    in_stack_fffffffffffffef8 = SharedLiterals::begin(local_20);
    uVar4 = SharedLiterals::size(local_20);
    (*in_stack_ffffffffffffff00->_vptr_DecisionHeuristic[9])
              (in_stack_ffffffffffffff00,pSVar7,in_stack_fffffffffffffef8,(ulong)uVar4,
               (ulong)local_28);
  }
  if ((local_68._4_4_ & 0x7fffffff) < 6) {
LAB_0022bda9:
    if (local_70 < (local_68._4_4_ & 0x7fffffff)) {
      if ((local_68._4_4_ & 0x7fffffff) < 6) {
        local_10.local =
             Clause::newClause((Solver *)
                               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                               in_stack_fffffffffffffe48);
      }
      else {
        local_10.local =
             newUnshared((Solver *)
                         CONCAT17(bVar9,CONCAT16(in_stack_ffffffffffffff16,
                                                 CONCAT24(in_stack_ffffffffffffff14,SVar3))),
                         (SharedLiterals *)CONCAT17(uVar1,in_stack_ffffffffffffff08),
                         (Literal *)in_stack_ffffffffffffff00,
                         (ConstraintInfo *)in_stack_fffffffffffffef8);
      }
    }
    else {
      ConstraintInfo::type(&local_68.info);
      SolverStats::addLearnt
                ((SolverStats *)CONCAT44(in_stack_fffffffffffffe44.rep,in_stack_fffffffffffffe40),
                 in_stack_fffffffffffffe3c,t_00);
      local_24 = local_24 | 1;
    }
  }
  else {
    this = Solver::sharedContext(local_18);
    bVar2 = SharedContext::physicalShare(this,local_28);
    if (!bVar2) goto LAB_0022bda9;
    local_10.local =
         Clause::newShared((Solver *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                           (SharedLiterals *)in_stack_fffffffffffffe48,
                           (InfoType *)
                           CONCAT44(in_stack_fffffffffffffe44.rep,in_stack_fffffffffffffe40),
                           (Literal *)CONCAT44(in_stack_fffffffffffffe3c,t_00),false);
    local_30.clause = (SharedLiterals *)0x0;
  }
  if ((local_24 & 1) == 0) {
    ConstraintInfo::type(&local_68.info);
    Solver::addLearnt((Solver *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                      (Constraint *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe44.rep,
                      in_stack_fffffffffffffe40);
  }
  if ((local_74 & status_asserting) != status_open) {
    if (local_10.local == (ClauseHead *)0x0) {
      Literal::operator~((Literal *)CONCAT44(in_stack_fffffffffffffe3c,t_00));
      Literal::operator~((Literal *)CONCAT44(in_stack_fffffffffffffe3c,t_00));
      Antecedent::Antecedent
                ((Antecedent *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (Literal *)in_stack_fffffffffffffe48,
                 (Literal *)CONCAT44(in_stack_fffffffffffffe44.rep,in_stack_fffffffffffffe40));
    }
    else {
      Antecedent::Antecedent(&local_80,&(local_10.local)->super_Constraint);
    }
    pSVar7 = local_18;
    p.rep_ = Literal::var(local_44);
    uVar4 = Solver::level((Solver *)
                          CONCAT44(in_stack_fffffffffffffe44.rep,in_stack_fffffffffffffe40),
                          in_stack_fffffffffffffe3c);
    bVar2 = Solver::force(pSVar7,p,uVar4,in_stack_fffffffffffffe68,uVar8);
    uVar6 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe70);
    local_10.status = status_unsat;
    if (bVar2) {
      local_10.status = status_unit;
    }
    if ((local_10.local != (ClauseHead *)0x0) && ((local_24 & 0x40) != 0)) {
      uVar8 = local_18._4_4_;
      last = SharedLiterals::begin(local_20);
      SharedLiterals::end((SharedLiterals *)
                          CONCAT44(in_stack_fffffffffffffe44.rep,in_stack_fffffffffffffe40));
      Solver::countLevels(pSVar7,(Literal *)CONCAT44(uVar4,uVar6),last,uVar8);
      ConstraintScore::activity((ConstraintScore *)&local_68);
      in_stack_fffffffffffffe44 = makeScore(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
      ClauseHead::resetScore
                ((ClauseHead *)CONCAT44(in_stack_fffffffffffffe3c,t_00),
                 (ScoreType)in_stack_fffffffffffffe44.rep);
    }
  }
LAB_0022c128:
  local_78 = 1;
  Detail::Sink::~Sink((Sink *)CONCAT44(in_stack_fffffffffffffe44.rep,in_stack_fffffffffffffe40));
  RVar5.status = local_10.status;
  RVar5.local = local_10.local;
  RVar5._12_4_ = 0;
  return RVar5;
}

Assistant:

ClauseCreator::Result ClauseCreator::integrate(Solver& s, SharedLiterals* clause, uint32 modeFlags, ConstraintType t) {
	assert(!s.hasConflict() && "ClauseCreator::integrate() - precondition violated!");
	Detail::Sink shared( (modeFlags & clause_no_release) == 0 ? clause : 0);
	// determine state of clause
	Literal temp[Clause::MAX_SHORT_LEN]; temp[0] = temp[1] = lit_false();
	ClauseRep x    = prepare(s, clause->begin(), clause->size(), ConstraintInfo(t), 0, temp, Clause::MAX_SHORT_LEN);
	uint32 impSize = (modeFlags & clause_explicit) != 0 || !s.allowImplicit(x) ? 1 : 3;
	Status xs      = status(s, x);
	if (ignoreClause(s, x, xs, modeFlags)) {
		return Result(0, xs);
	}
	Result result(0, xs);
	if ((modeFlags & clause_no_heuristic) == 0) { s.heuristic()->newConstraint(s, clause->begin(), clause->size(), t); }
	if (x.size > Clause::MAX_SHORT_LEN && s.sharedContext()->physicalShare(t)) {
		result.local  = Clause::newShared(s, clause, x.info, temp, shared.clause == 0);
		shared.clause = 0;
	}
	else if (x.size > impSize) {
		result.local  = x.size <= Clause::MAX_SHORT_LEN ? Clause::newClause(s, x) : newUnshared(s, clause, temp, x.info);
	}
	else {
		// unary clause or implicitly shared via binary/ternary implication graph;
		// only check for implication/conflict but do not create
		// a local representation for the clause
		s.stats.addLearnt(x.size, x.info.type());
		modeFlags |= clause_no_add;
	}
	if ((modeFlags & clause_no_add) == 0) { s.addLearnt(result.local, x.size, x.info.type()); }
	if ((xs & (status_unit|status_unsat)) != 0) {
		Antecedent ante = result.local ? Antecedent(result.local) : Antecedent(~temp[1], ~temp[2]);
		uint32 impLevel = s.level(temp[1].var());
		result.status   = s.force(temp[0], impLevel, ante) ? status_unit : status_unsat;
		if (result.local && (modeFlags & clause_int_lbd) != 0) {
			uint32 lbd = s.countLevels(clause->begin(), clause->end());
			result.local->resetScore(makeScore(x.info.activity(), lbd));
		}
	}
	return result;
}